

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathNodeSetContains(xmlNodeSetPtr cur,xmlNodePtr val)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNsPtr ns1;
  long lVar3;
  
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    if (val->type == XML_NAMESPACE_DECL) {
      if (cur->nodeNr < 1) {
        return 0;
      }
      lVar3 = 0;
      do {
        pxVar1 = cur->nodeTab[lVar3];
        if (pxVar1->type == XML_NAMESPACE_DECL) {
          if (pxVar1 == val) {
            return 1;
          }
          if (((val->_private != (void *)0x0) && (pxVar1->_private == val->_private)) &&
             (iVar2 = xmlStrEqual((xmlChar *)val->children,(xmlChar *)pxVar1->children), iVar2 != 0)
             ) {
            return 1;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < cur->nodeNr);
    }
    else {
      if ((long)cur->nodeNr < 1) {
        return 0;
      }
      lVar3 = 0;
      do {
        if (cur->nodeTab[lVar3] == val) {
          return 1;
        }
        lVar3 = lVar3 + 1;
      } while (cur->nodeNr != lVar3);
    }
  }
  return 0;
}

Assistant:

int
xmlXPathNodeSetContains (xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(0);
    if (val->type == XML_NAMESPACE_DECL) {
	for (i = 0; i < cur->nodeNr; i++) {
	    if (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) {
		xmlNsPtr ns1, ns2;

		ns1 = (xmlNsPtr) val;
		ns2 = (xmlNsPtr) cur->nodeTab[i];
		if (ns1 == ns2)
		    return(1);
		if ((ns1->next != NULL) && (ns2->next == ns1->next) &&
	            (xmlStrEqual(ns1->prefix, ns2->prefix)))
		    return(1);
	    }
	}
    } else {
	for (i = 0; i < cur->nodeNr; i++) {
	    if (cur->nodeTab[i] == val)
		return(1);
	}
    }
    return(0);
}